

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LongReadsDatastore.hpp
# Opt level: O2

void __thiscall LongReadsDatastore::~LongReadsDatastore(LongReadsDatastore *this)

{
  if (this->fd != 0) {
    close(this->fd);
  }
  LongReadsMapper::~LongReadsMapper(&this->mapper);
  std::__cxx11::string::~string((string *)&this->default_name);
  std::__cxx11::string::~string((string *)&this->name);
  std::__cxx11::string::~string((string *)&this->filename);
  std::_Vector_base<ReadPosSize,_std::allocator<ReadPosSize>_>::~_Vector_base
            (&(this->read_to_fileRecord).
              super__Vector_base<ReadPosSize,_std::allocator<ReadPosSize>_>);
  return;
}

Assistant:

~LongReadsDatastore(){
        if (fd) {
            close(fd);
        }
    }